

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::SetConnectIndex
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,int i,int64_t connectindex)

{
  int iVar1;
  ostream *poVar2;
  
  if (-1 < i) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))();
    if (i < iVar1) {
      (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)i] = connectindex;
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," TPZCompElHCurl<TSHAPE>::SetConnectIndex index ",0x2f);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," out of range\n",0xe);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
             ,0xdd);
}

Assistant:

void TPZCompElHCurl<TSHAPE>::SetConnectIndex(int i, int64_t connectindex){
#ifndef PZNODEBUG
    if(i<0 || i>= this->NConnects()) {
        std::cout << " TPZCompElHCurl<TSHAPE>::SetConnectIndex index " << i <<
                  " out of range\n";
        DebugStop();
        return;
    }
#endif
    this-> fConnectIndexes[i] = connectindex;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << std::endl<<"Setting Connect : " << i << " to connectindex " << connectindex<<std::endl;
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
}